

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O2

void Curl_uint_hash_destroy(uint_hash *h)

{
  if (h->table != (uint_hash_entry **)0x0) {
    uint_hash_clear(h);
    (*Curl_cfree)(h->table);
    h->table = (uint_hash_entry **)0x0;
  }
  h->slots = 0;
  return;
}

Assistant:

void Curl_uint_hash_destroy(struct uint_hash *h)
{
  DEBUGASSERT(h->init == CURL_UINTHASHINIT);
  if(h->table) {
    uint_hash_clear(h);
    Curl_safefree(h->table);
  }
  DEBUGASSERT(h->size == 0);
  h->slots = 0;
}